

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O3

Vec_Str_t * Pdr_ManDumpString(Pdr_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  size_t __size;
  int iVar2;
  Vec_Str_t *vStr;
  char *pcVar3;
  Vec_Ptr_t *vCubes;
  void **__dest;
  Vec_Int_t *vFlopCounts;
  uint uVar4;
  long lVar5;
  
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  vStr->nSize = 0;
  pcVar3 = (char *)malloc(1000);
  vStr->pArray = pcVar3;
  iVar2 = Pdr_ManFindInvariantStart(p);
  pVVar1 = p->vInfCubes;
  if (pVVar1 == (Vec_Ptr_t *)0x0) {
    vCubes = Pdr_ManCollectCubes(p,iVar2);
    uVar4 = vCubes->nSize;
  }
  else {
    vCubes = (Vec_Ptr_t *)malloc(0x10);
    uVar4 = pVVar1->nSize;
    vCubes->nSize = uVar4;
    iVar2 = pVVar1->nCap;
    vCubes->nCap = iVar2;
    if ((long)iVar2 == 0) {
      __dest = (void **)0x0;
    }
    else {
      __dest = (void **)malloc((long)iVar2 << 3);
    }
    vCubes->pArray = __dest;
    memcpy(__dest,pVVar1->pArray,(long)(int)uVar4 << 3);
  }
  if (1 < (int)uVar4) {
    qsort(vCubes->pArray,(ulong)uVar4,8,Pdr_SetCompare);
  }
  if (p->pPars->fUseSupp == 0) {
    vFlopCounts = (Vec_Int_t *)0x0;
  }
  else {
    vFlopCounts = Pdr_ManCountFlops(p,vCubes);
  }
  iVar2 = vCubes->nSize;
  if (0 < iVar2) {
    lVar5 = 0;
    do {
      if (((Pdr_Set_t *)vCubes->pArray[lVar5])->nRefs != -1) {
        Pdr_SetPrintStr(vStr,(Pdr_Set_t *)vCubes->pArray[lVar5],p->pAig->nRegs,vFlopCounts);
        iVar2 = vCubes->nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar2);
  }
  if (vFlopCounts != (Vec_Int_t *)0x0) {
    if (vFlopCounts->pArray != (int *)0x0) {
      free(vFlopCounts->pArray);
    }
    free(vFlopCounts);
  }
  if (vCubes->pArray != (void **)0x0) {
    free(vCubes->pArray);
  }
  free(vCubes);
  uVar4 = vStr->nSize;
  if (uVar4 == vStr->nCap) {
    if ((int)uVar4 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar3;
      vStr->nCap = 0x10;
    }
    else {
      __size = (ulong)uVar4 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(__size);
      }
      else {
        pcVar3 = (char *)realloc(vStr->pArray,__size);
      }
      vStr->pArray = pcVar3;
      vStr->nCap = (int)__size;
    }
  }
  else {
    pcVar3 = vStr->pArray;
  }
  iVar2 = vStr->nSize;
  vStr->nSize = iVar2 + 1;
  pcVar3[iVar2] = '\0';
  return vStr;
}

Assistant:

Vec_Str_t * Pdr_ManDumpString( Pdr_Man_t * p )
{
    Vec_Str_t * vStr;
    Vec_Int_t * vFlopCounts;
    Vec_Ptr_t * vCubes;
    Pdr_Set_t * pCube;
    int i, kStart;
    vStr = Vec_StrAlloc( 1000 );
    // collect cubes
    kStart = Pdr_ManFindInvariantStart( p );
    if ( p->vInfCubes == NULL )
        vCubes = Pdr_ManCollectCubes( p, kStart );
    else
        vCubes = Vec_PtrDup( p->vInfCubes );
    Vec_PtrSort( vCubes, (int (*)(void))Pdr_SetCompare );
    // collect variable appearances
    vFlopCounts = p->pPars->fUseSupp ? Pdr_ManCountFlops( p, vCubes ) : NULL; 
    // output cubes
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 )
            continue;
        Pdr_SetPrintStr( vStr, pCube, Aig_ManRegNum(p->pAig), vFlopCounts );  
    }
    Vec_IntFreeP( &vFlopCounts );
    Vec_PtrFree( vCubes );
    Vec_StrPush( vStr, '\0' );
    return vStr;
}